

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O2

bool __thiscall
Shell::EqualityProxyMono::getArgumentEqualityLiterals
          (EqualityProxyMono *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType,bool skipSortsWithoutEquality)

{
  bool bVar1;
  TermList sort;
  Literal *elem;
  ulong uVar2;
  OperatorType *this_00;
  uint uVar3;
  TermList arg1;
  TermList arg0;
  
  lits->_cursor = lits->_stack;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  uVar3 = 5;
  uVar2 = 0;
  do {
    if (cnt == uVar2) {
      return lits->_cursor != lits->_stack;
    }
    arg0._content._0_4_ = uVar3 - 4;
    arg0._content._4_4_ = 0;
    this_00 = symbolType;
    sort = Kernel::OperatorType::arg(symbolType,(uint)uVar2);
    if (skipSortsWithoutEquality) {
      bVar1 = haveProxyPredicate((EqualityProxyMono *)this_00,sort);
      arg1._content = arg0._content;
      if (bVar1) goto LAB_00549cba;
    }
    else {
LAB_00549cba:
      arg1._content._4_4_ = 0;
      arg1._content._0_4_ = uVar3;
      elem = makeProxyLiteral(this,false,arg0,arg1,sort);
      Lib::Stack<Kernel::Literal_*>::push(lits,elem);
    }
    Lib::Stack<Kernel::TermList>::push(vars1,arg0);
    Lib::Stack<Kernel::TermList>::push(vars2,arg1);
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + 8;
  } while( true );
}

Assistant:

bool EqualityProxyMono::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType, bool skipSortsWithoutEquality)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if (!skipSortsWithoutEquality || haveProxyPredicate(sort)) {
      lits.push(makeProxyLiteral(false, v1, v2, sort));
      vars1.push(v1);
      vars2.push(v2);
    }
    else {
      vars1.push(v1);
      vars2.push(v1);
    }
  }
  return lits.isNonEmpty();
}